

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_prefork.cpp
# Opt level: O0

void async_pid_writer(error_code *e)

{
  stream_socket *psVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *this;
  error_code *in_RDI;
  int pid;
  ostringstream oss;
  longlong in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdd0;
  mutable_buffer *in_stack_fffffffffffffdd8;
  ostringstream *this_00;
  const_buffer *in_stack_fffffffffffffde0;
  string local_1b0 [48];
  ostringstream local_180 [384];
  
  bVar2 = std::error_code::operator_cast_to_bool(in_RDI);
  if (!bVar2) {
    getpid();
    psVar1 = accepted_socket;
    booster::aio::buffer(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    booster::aio::const_buffer::const_buffer(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    booster::aio::stream_socket::write((const_buffer *)psVar1);
    booster::aio::const_buffer::~const_buffer((const_buffer *)0x109234);
    booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x10923e);
    booster::ptime::millisleep(in_stack_fffffffffffffdc0);
    booster::aio::basic_io_device::close();
    booster::aio::io_service::stop();
    return;
  }
  this_00 = local_180;
  std::__cxx11::ostringstream::ostringstream(this_00);
  poVar3 = std::operator<<((ostream *)this_00,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_prefork.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x54);
  std::operator<<(poVar3," !e");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_1b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void async_pid_writer(sys::error_code const &e)
{
	TEST(!e);
	int pid=getpid();
	accepted_socket->write(io::buffer(&pid,sizeof(pid)));
	booster::ptime::millisleep(100);
	accepted_socket->close();
	the_service->stop();
}